

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

int __thiscall capnp::DynamicList::Builder::init(Builder *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  Which elementType_00;
  SegmentBuilder *pSVar2;
  CapTableBuilder *pCVar3;
  undefined8 uVar4;
  ElementSize elementSize;
  undefined2 uVar5;
  StructSize elementSize_00;
  ByteCount in_ECX;
  uint in_EDX;
  ListBuilder *__return_storage_ptr__;
  Builder BVar6;
  Type TVar7;
  Schema in_stack_ffffffffffffff28;
  Fault f;
  ListSchema elementType;
  anon_union_8_2_eba6ea51_for_Type_5 local_98;
  SegmentBuilder *pSStack_90;
  CapTableBuilder *local_88;
  ListBuilder local_80;
  ListBuilder local_58;
  
  if (*(uint *)(ctx + 0x28) <= in_EDX) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x4e0,FAILED,"index < this->size()","\"List index out-of-bounds.\"",
               (char (*) [26])"List index out-of-bounds.");
    kj::_::Debug::Fault::fatal(&f);
  }
  uVar5 = 0xe;
  if (ctx[2] == (EVP_PKEY_CTX)0x0) {
    uVar5 = *(undefined2 *)ctx;
  }
  switch(uVar5) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xf:
  case 0x10:
  case 0x11:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[25]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x4f2,FAILED,(char *)0x0,"\"Expected a list or blob.\"",
               (char (*) [25])"Expected a list or blob.");
    kj::_::Debug::Fault::fatal(&f);
  case 0xc:
    f.exception = *(Exception **)(ctx + 0x10);
    _::PointerBuilder::initBlob<capnp::Text>((Builder *)&local_98,(PointerBuilder *)&f,in_ECX);
    (this->builder).capTable = local_88;
    (this->schema).elementType.field_4 = local_98;
    (this->builder).segment = pSStack_90;
    (this->schema).elementType.baseType = UINT8;
    (this->schema).elementType.listDepth = '\0';
    (this->schema).elementType.isImplicitParam = false;
    break;
  case 0xd:
    f.exception = *(Exception **)(ctx + 0x10);
    BVar6 = _::PointerBuilder::initBlob<capnp::Data>((PointerBuilder *)&f,in_ECX);
    (this->schema).elementType.baseType = UINT16;
    (this->schema).elementType.listDepth = '\0';
    (this->schema).elementType.isImplicitParam = false;
    *(ArrayPtr<unsigned_char> *)&(this->schema).elementType.field_4 =
         BVar6.super_ArrayPtr<unsigned_char>;
    break;
  case 0xe:
    TVar7 = (Type)Type::asList((Type *)ctx);
    elementType.elementType = TVar7;
    if (TVar7.baseType == STRUCT &&
        ((undefined1  [16])TVar7 & (undefined1  [16])0xff0000) == (undefined1  [16])0x0) {
      f.exception = *(Exception **)(ctx + 0x10);
      Type::asStruct(&elementType.elementType);
      elementSize_00 =
           anon_unknown_71::structSizeFromSchema((StructSchema)in_stack_ffffffffffffff28.raw);
      __return_storage_ptr__ = &local_58;
      _::PointerBuilder::initStructList
                (__return_storage_ptr__,(PointerBuilder *)&f,in_ECX,elementSize_00);
    }
    else {
      f.exception = *(Exception **)(ctx + 0x10);
      elementType_00 = LIST;
      if (((undefined1  [16])TVar7 & (undefined1  [16])0xff0000) == (undefined1  [16])0x0) {
        elementType_00 = TVar7.baseType;
      }
      elementSize = anon_unknown_71::elementSizeFor(elementType_00);
      __return_storage_ptr__ = &local_80;
      _::PointerBuilder::initList(__return_storage_ptr__,(PointerBuilder *)&f,elementSize,in_ECX);
    }
    uVar1._0_4_ = __return_storage_ptr__->structDataSize;
    uVar1._4_2_ = __return_storage_ptr__->structPointerCount;
    uVar1._6_1_ = __return_storage_ptr__->elementSize;
    uVar1._7_1_ = __return_storage_ptr__->field_0x27;
    this[1].schema.elementType.baseType = (short)(undefined4)uVar1;
    this[1].schema.elementType.listDepth = (char)((ulong)uVar1 >> 0x10);
    this[1].schema.elementType.isImplicitParam = (bool)(char)((ulong)uVar1 >> 0x18);
    this[1].schema.elementType.field_3 =
         (anon_union_2_2_d12d5221_for_Type_3)(short)((ulong)uVar1 >> 0x20);
    *(short *)&this[1].schema.elementType.field_0x6 = (short)((ulong)uVar1 >> 0x30);
    pSVar2 = __return_storage_ptr__->segment;
    pCVar3 = __return_storage_ptr__->capTable;
    uVar4._0_4_ = __return_storage_ptr__->elementCount;
    uVar4._4_4_ = __return_storage_ptr__->step;
    *(byte **)&(this->builder).elementCount = __return_storage_ptr__->ptr;
    (this->builder).structDataSize = (undefined4)uVar4;
    (this->builder).structPointerCount = (short)((ulong)uVar4 >> 0x20);
    (this->builder).elementSize = (char)((ulong)uVar4 >> 0x30);
    (this->builder).field_0x27 = (char)((ulong)uVar4 >> 0x38);
    (this->builder).capTable = (CapTableBuilder *)pSVar2;
    (this->builder).ptr = (byte *)pCVar3;
    (this->schema).elementType.baseType = UINT32;
    (this->schema).elementType.listDepth = '\0';
    (this->schema).elementType.isImplicitParam = false;
    *(Type *)&(this->schema).elementType.field_4 = TVar7;
    break;
  case 0x12:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x50e,FAILED,(char *)0x0,"\"List(AnyPointer) not supported.\"",
               (char (*) [32])"List(AnyPointer) not supported.");
    kj::_::Debug::Fault::fatal(&f);
  default:
    (this->schema).elementType.baseType = VOID;
    (this->schema).elementType.listDepth = '\0';
    (this->schema).elementType.isImplicitParam = false;
  }
  return (int)this;
}

Assistant:

DynamicValue::Builder DynamicList::Builder::init(uint index, uint size) {
  KJ_REQUIRE(index < this->size(), "List index out-of-bounds.");

  switch (schema.whichElementType()) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::ENUM:
    case schema::Type::STRUCT:
    case schema::Type::INTERFACE:
      KJ_FAIL_REQUIRE("Expected a list or blob.");
      return nullptr;

    case schema::Type::TEXT:
      return builder.getPointerElement(bounded(index) * ELEMENTS)
                    .initBlob<Text>(bounded(size) * BYTES);

    case schema::Type::DATA:
      return builder.getPointerElement(bounded(index) * ELEMENTS)
                    .initBlob<Data>(bounded(size) * BYTES);

    case schema::Type::LIST: {
      auto elementType = schema.getListElementType();

      if (elementType.whichElementType() == schema::Type::STRUCT) {
        return DynamicList::Builder(elementType,
            builder.getPointerElement(bounded(index) * ELEMENTS)
                   .initStructList(bounded(size) * ELEMENTS,
                                   structSizeFromSchema(elementType.getStructElementType())));
      } else {
        return DynamicList::Builder(elementType,
            builder.getPointerElement(bounded(index) * ELEMENTS)
                   .initList(elementSizeFor(elementType.whichElementType()),
                             bounded(size) * ELEMENTS));
      }
    }

    case schema::Type::ANY_POINTER: {
      KJ_FAIL_ASSERT("List(AnyPointer) not supported.");
      return nullptr;
    }
  }

  return nullptr;
}